

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O3

SUNErrCode SUNAdaptController_Space(SUNAdaptController C,long *lenrw,long *leniw)

{
  _func_SUNErrCode_SUNAdaptController_long_ptr_long_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  if (C == (SUNAdaptController)0x0) {
    SVar1 = -9999;
  }
  else {
    SVar1 = 0;
    *lenrw = 0;
    *leniw = 0;
    UNRECOVERED_JUMPTABLE = C->ops->space;
    if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNAdaptController_long_ptr_long_ptr *)0x0) {
      SVar1 = (*UNRECOVERED_JUMPTABLE)(C,lenrw,leniw);
      return SVar1;
    }
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNAdaptController_Space(SUNAdaptController C, long int* lenrw,
                                    long int* leniw)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = 0; /* initialize outputs with identity */
  *leniw = 0;
  if (C->ops->space) { ier = C->ops->space(C, lenrw, leniw); }
  return (ier);
}